

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

Table * luaH_new(lua_State *L)

{
  Table *pTVar1;
  
  pTVar1 = (Table *)luaC_newobj(L,'\x05',0x30);
  pTVar1->metatable = (Table *)0x0;
  pTVar1->array = (Value *)0x0;
  pTVar1->asize = 0;
  pTVar1->node = &dummynode_;
  pTVar1->flags = '\x7f';
  pTVar1->lsizenode = '\0';
  return pTVar1;
}

Assistant:

Table *luaH_new (lua_State *L) {
  GCObject *o = luaC_newobj(L, LUA_VTABLE, sizeof(Table));
  Table *t = gco2t(o);
  t->metatable = NULL;
  t->flags = maskflags;  /* table has no metamethod fields */
  t->array = NULL;
  t->asize = 0;
  setnodevector(L, t, 0);
  return t;
}